

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void handle_fmov(DisasContext_conflict1 *s,int rd,int rn,int type,_Bool itof)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_ptr pTVar1;
  int iVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  TCGv_i64 tcg_rd;
  TCGv_i64 tmp;
  TCGv_i64 tcg_rn;
  TCGContext_conflict1 *tcg_ctx;
  _Bool itof_local;
  int type_local;
  int rn_local;
  int rd_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (itof) {
    pTVar3 = cpu_reg_aarch64(s,rn);
    switch(type) {
    case 0:
      pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
      tcg_gen_ext32u_i64_aarch64(tcg_ctx_00,pTVar4,pTVar3);
      write_fp_dreg_aarch64(s,rd,pTVar4);
      tcg_temp_free_i64(tcg_ctx_00,pTVar4);
      break;
    case 1:
      write_fp_dreg_aarch64(s,rd,pTVar3);
      break;
    case 2:
      pTVar1 = tcg_ctx_00->cpu_env;
      iVar2 = fp_reg_hi_offset(s,rd);
      tcg_gen_st_i64_aarch64(tcg_ctx_00,pTVar3,pTVar1,(long)iVar2);
      clear_vec_high(s,true,rd);
      break;
    case 3:
      pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
      tcg_gen_ext16u_i64_aarch64(tcg_ctx_00,pTVar4,pTVar3);
      write_fp_dreg_aarch64(s,rd,pTVar4);
      tcg_temp_free_i64(tcg_ctx_00,pTVar4);
      break;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,0x1b23,(char *)0x0);
    }
  }
  else {
    pTVar3 = cpu_reg_aarch64(s,rd);
    switch(type) {
    case 0:
      pTVar1 = tcg_ctx_00->cpu_env;
      iVar2 = fp_reg_offset(s,rn,MO_32);
      tcg_gen_ld32u_i64_aarch64(tcg_ctx_00,pTVar3,pTVar1,(long)iVar2);
      break;
    case 1:
      pTVar1 = tcg_ctx_00->cpu_env;
      iVar2 = fp_reg_offset(s,rn,MO_64);
      tcg_gen_ld_i64_aarch64(tcg_ctx_00,pTVar3,pTVar1,(long)iVar2);
      break;
    case 2:
      pTVar1 = tcg_ctx_00->cpu_env;
      iVar2 = fp_reg_hi_offset(s,rn);
      tcg_gen_ld_i64_aarch64(tcg_ctx_00,pTVar3,pTVar1,(long)iVar2);
      break;
    case 3:
      pTVar1 = tcg_ctx_00->cpu_env;
      iVar2 = fp_reg_offset(s,rn,MO_16);
      tcg_gen_ld16u_i64_aarch64(tcg_ctx_00,pTVar3,pTVar1,(long)iVar2);
      break;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,0x1b3a,(char *)0x0);
    }
  }
  return;
}

Assistant:

static void handle_fmov(DisasContext *s, int rd, int rn, int type, bool itof)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* FMOV: gpr to or from float, double, or top half of quad fp reg,
     * without conversion.
     */

    if (itof) {
        TCGv_i64 tcg_rn = cpu_reg(s, rn);
        TCGv_i64 tmp;

        switch (type) {
        case 0:
            /* 32 bit */
            tmp = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_ext32u_i64(tcg_ctx, tmp, tcg_rn);
            write_fp_dreg(s, rd, tmp);
            tcg_temp_free_i64(tcg_ctx, tmp);
            break;
        case 1:
            /* 64 bit */
            write_fp_dreg(s, rd, tcg_rn);
            break;
        case 2:
            /* 64 bit to top half. */
            tcg_gen_st_i64(tcg_ctx, tcg_rn, tcg_ctx->cpu_env, fp_reg_hi_offset(s, rd));
            clear_vec_high(s, true, rd);
            break;
        case 3:
            /* 16 bit */
            tmp = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_ext16u_i64(tcg_ctx, tmp, tcg_rn);
            write_fp_dreg(s, rd, tmp);
            tcg_temp_free_i64(tcg_ctx, tmp);
            break;
        default:
            g_assert_not_reached();
        }
    } else {
        TCGv_i64 tcg_rd = cpu_reg(s, rd);

        switch (type) {
        case 0:
            /* 32 bit */
            tcg_gen_ld32u_i64(tcg_ctx, tcg_rd, tcg_ctx->cpu_env, fp_reg_offset(s, rn, MO_32));
            break;
        case 1:
            /* 64 bit */
            tcg_gen_ld_i64(tcg_ctx, tcg_rd, tcg_ctx->cpu_env, fp_reg_offset(s, rn, MO_64));
            break;
        case 2:
            /* 64 bits from top half */
            tcg_gen_ld_i64(tcg_ctx, tcg_rd, tcg_ctx->cpu_env, fp_reg_hi_offset(s, rn));
            break;
        case 3:
            /* 16 bit */
            tcg_gen_ld16u_i64(tcg_ctx, tcg_rd, tcg_ctx->cpu_env, fp_reg_offset(s, rn, MO_16));
            break;
        default:
            g_assert_not_reached();
        }
    }
}